

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O0

void __thiscall
GrcMasterValueList::AddItem
          (GrcMasterValueList *this,Symbol psym,GdlExpression *pexpValue,int nPR,int munitPR,
          bool fOverride,GrpLineAndFile *lnf,string *staDescription)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  GdlAssignment *this_00;
  pointer ppVar4;
  uint in_ECX;
  undefined8 in_RDX;
  GrcSymbolTableEntry *in_RSI;
  string *in_RDI;
  uint in_R8D;
  byte in_R9B;
  GrpLineAndFile *in_stack_00000008;
  string *in_stack_00000010;
  ValuePair hmpair;
  iterator hmit;
  GdlAssignment *pasgn;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  GrpLineAndFile *in_stack_ffffffffffffff10;
  pair<GrcSymbolTableEntry_*,_GdlAssignment_*> *in_stack_ffffffffffffff18;
  allocator *paVar5;
  map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
  *in_stack_ffffffffffffff20;
  GdlExpression *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff48;
  GdlObject *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  GrcErrorList *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [48];
  pair<GrcSymbolTableEntry_*,_GdlAssignment_*> local_60 [2];
  _Self local_40;
  _Self local_38;
  GrcAssignment *local_30;
  byte local_21;
  uint local_20;
  uint local_1c;
  undefined8 local_18;
  GrcSymbolTableEntry *local_10;
  
  local_21 = in_R9B & 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
       ::find((map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),(key_type *)0x1bcad9)
  ;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
       ::end((map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
              *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    this_00 = (GdlAssignment *)operator_new(0x48);
    GdlAssignment::GdlAssignment
              (this_00,in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
               (int)in_stack_ffffffffffffff20,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
               in_stack_ffffffffffffff10);
    local_30 = &this_00->super_GrcAssignment;
    std::pair<GrcSymbolTableEntry_*,_GdlAssignment_*>::
    pair<GrcSymbolTableEntry_*,_GdlAssignment_*,_true>(local_60);
    local_60[0].first = local_10;
    local_60[0].second = (GdlAssignment *)local_30;
    std::
    map<GrcSymbolTableEntry*,GdlAssignment*,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>>
    ::insert<std::pair<GrcSymbolTableEntry*,GdlAssignment*>&>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    ppVar4 = std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>::
             operator->((_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>
                         *)in_stack_ffffffffffffff10);
    local_30 = &ppVar4->second->super_GrcAssignment;
    paVar5 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Duplicate ",paVar5);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff48,in_stack_00000010);
    GrcErrorList::AddWarning
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    iVar2 = GrpLineAndFile::PreProcessedLine(in_stack_00000008);
    iVar3 = GrcAssignment::PreProcessedLine((GrcAssignment *)0x1bccc1);
    if ((iVar2 <= iVar3) || ((local_21 & 1) == 0)) {
      iVar2 = GrpLineAndFile::PreProcessedLine(in_stack_00000008);
      iVar3 = GrcAssignment::PreProcessedLine((GrcAssignment *)0x1bccf2);
      if (iVar3 <= iVar2) {
        return;
      }
      bVar1 = GrcAssignment::Override(local_30);
      if (bVar1) {
        return;
      }
    }
    (*((GrcAssignment *)&local_30->_vptr_GrcAssignment)->_vptr_GrcAssignment[2])
              (local_30,local_18,(ulong)local_1c,(ulong)local_20,(ulong)(local_21 & 1),
               in_stack_00000008);
  }
  return;
}

Assistant:

void GrcMasterValueList::AddItem(Symbol psym, GdlExpression * pexpValue,
	int nPR, int munitPR, bool fOverride, GrpLineAndFile const& lnf,
	std::string staDescription)
{
	GdlAssignment * pasgn;
	
	ValueMap::iterator hmit = m_valmapEntries.find(psym);
	if (hmit == m_valmapEntries.end())
	//if (!m_valmapEntries.Retrieve(psym, &pasgn) || !pasgn)
	{
		pasgn = new GdlAssignment(pexpValue, nPR, munitPR, fOverride, lnf);
		ValuePair hmpair;
		hmpair.first = psym;
		hmpair.second = pasgn;
		m_valmapEntries.insert(hmpair);
		//m_valmapEntries.Insert(psym, pasgn);
	}
	else
	{
		pasgn = hmit->second;
		g_errorList.AddWarning(2524, pexpValue,
			"Duplicate ", staDescription);
		
		if ((lnf.PreProcessedLine() > pasgn->PreProcessedLine() && fOverride) ||
			(lnf.PreProcessedLine() < pasgn->PreProcessedLine() && !pasgn->Override()))
		{
			pasgn->Set(pexpValue, nPR, munitPR, fOverride, lnf);
		}
	}
}